

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O2

char * Diligent::GetBindingRangeName(BINDING_RANGE Range)

{
  if (Range < BINDING_RANGE_COUNT) {
    return &DAT_002c0464 + *(int *)(&DAT_002c0464 + (ulong)Range * 4);
  }
  return "Unknown";
}

Assistant:

const char* GetBindingRangeName(BINDING_RANGE Range)
{
    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (Range)
    {
        // clang-format off
        case BINDING_RANGE_UNIFORM_BUFFER: return "Uniform buffer";
        case BINDING_RANGE_TEXTURE:        return "Texture";
        case BINDING_RANGE_IMAGE:          return "Image";
        case BINDING_RANGE_STORAGE_BUFFER: return "Storage buffer";
        // clang-format on
        default:
            return "Unknown";
    }
}